

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

void duckdb::ApproxQuantileListOperation<long>::
     Finalize<duckdb::list_entry_t,duckdb::ApproxQuantileState>
               (ApproxQuantileState *state,list_entry_t *target,AggregateFinalizeData *finalize_data
               )

{
  AggregateInputData *this;
  FunctionData *pFVar1;
  data_ptr_t pdVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  bool bVar5;
  Vector *pVVar6;
  idx_t iVar7;
  reference pvVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  size_type __n;
  Value input;
  undefined8 local_40;
  
  if (state->pos != 0) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar1 = (this->bind_data).ptr;
    pVVar6 = ListVector::GetEntry(finalize_data->result);
    iVar7 = ListVector::GetListSize(finalize_data->result);
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar1[2]._vptr_FunctionData - (long)pFVar1[1]._vptr_FunctionData >>
                        2) + iVar7);
    pdVar2 = pVVar6->data;
    duckdb_tdigest::TDigest::process(state->h);
    target->offset = iVar7;
    pp_Var3 = pFVar1[2]._vptr_FunctionData;
    pp_Var4 = pFVar1[1]._vptr_FunctionData;
    uVar11 = (long)pp_Var3 - (long)pp_Var4 >> 2;
    target->length = uVar11;
    if (pp_Var3 != pp_Var4) {
      lVar10 = 0;
      local_40 = 0x8000000000000000;
      __n = 0;
      do {
        pvVar8 = vector<float,_true>::operator[]((vector<float,_true> *)(pFVar1 + 1),__n);
        input = duckdb_tdigest::TDigest::quantile(state->h,(double)*pvVar8);
        bVar5 = TryCast::Operation<double,long>
                          (input,(int64_t *)(pdVar2 + lVar10 + iVar7 * 8),false);
        if (!bVar5) {
          uVar9 = 0x7fffffffffffffff;
          if (input < 0.0) {
            uVar9 = local_40;
          }
          *(undefined8 *)(pdVar2 + __n * 8 + iVar7 * 8) = uVar9;
        }
        __n = __n + 1;
        uVar11 = target->length;
        lVar10 = lVar10 + 8;
      } while (__n < uVar11);
    }
    ListVector::SetListSize(finalize_data->result,uVar11 + target->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, RESULT_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ApproximateQuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		D_ASSERT(state.h);
		state.h->compress();

		auto &entry = target;
		entry.offset = ridx;
		entry.length = bind_data.quantiles.size();
		for (size_t q = 0; q < entry.length; ++q) {
			const auto &quantile = bind_data.quantiles[q];
			const auto &source = state.h->quantile(quantile);
			auto &target = rdata[ridx + q];
			ApproxQuantileCoding::Decode(source, target);
		}

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}